

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# print.h
# Opt level: O3

void pbrt::detail::
     stringPrintfRecursive<pbrt::SceneEntity_const&,pbrt::SceneEntity_const&,pbrt::SceneEntity_const&,std::vector<std::pair<std::__cxx11::string,pbrt::SceneEntity>,std::allocator<std::pair<std::__cxx11::string,pbrt::SceneEntity>>>const&,std::vector<pbrt::SceneEntity,std::allocator<pbrt::SceneEntity>>const&,std::map<std::__cxx11::string,pbrt::TransformedSceneEntity,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,pbrt::TransformedSceneEntity>>>const&,std::vector<std::pair<std::__cxx11::string,pbrt::TextureSceneEntity>,std::allocator<std::pair<std::__cxx11::string,pbrt::TextureSceneEntity>>>const&,std::vector<std::pair<std::__cxx11::string,pbrt::TextureSceneEntity>,std::allocator<std::pair<std::__cxx11::string,pbrt::TextureSceneEntity>>>const&,std::map<std::__cxx11::string,pbrt::InstanceDefinitionSceneEntity,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,pbrt::InstanceDefinitionSceneEntity>>>const&,std::vector<pbrt::LightSceneEntity,std::allocator<pbrt::LightSceneEntity>>const&,std::vector<pbrt::ShapeSceneEntity,std::allocator<pbrt::ShapeSceneEntity>>const&,std::vector<pbrt::InstanceSceneEntity,std::allocator<pbrt::InstanceSceneEntity>>const&>
               (string *s,char *fmt,SceneEntity *v,SceneEntity *args,SceneEntity *args_1,
               vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pbrt::SceneEntity>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pbrt::SceneEntity>_>_>
               *args_2,vector<pbrt::SceneEntity,_std::allocator<pbrt::SceneEntity>_> *args_3,
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pbrt::TransformedSceneEntity,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pbrt::TransformedSceneEntity>_>_>
               *args_4,vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pbrt::TextureSceneEntity>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pbrt::TextureSceneEntity>_>_>
                       *args_5,
               vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pbrt::TextureSceneEntity>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pbrt::TextureSceneEntity>_>_>
               *args_6,map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pbrt::InstanceDefinitionSceneEntity,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pbrt::InstanceDefinitionSceneEntity>_>_>
                       *args_7,
               vector<pbrt::LightSceneEntity,_std::allocator<pbrt::LightSceneEntity>_> *args_8,
               vector<pbrt::ShapeSceneEntity,_std::allocator<pbrt::ShapeSceneEntity>_> *args_9,
               vector<pbrt::InstanceSceneEntity,_std::allocator<pbrt::InstanceSceneEntity>_>
               *args_10)

{
  _Alloc_hider __format;
  long *plVar1;
  int iVar2;
  long lVar3;
  long lVar4;
  long lVar5;
  char *s_00;
  string str;
  string nextFmt;
  char *fmt_local;
  long *local_1d8;
  long local_1c8 [2];
  stringstream ss;
  ostream local_1a8 [112];
  ios_base local_138 [264];
  
  fmt_local = fmt;
  copyToFormatString(&nextFmt,&fmt_local,s);
  lVar3 = std::__cxx11::string::find('\0',0x2a);
  lVar4 = std::__cxx11::string::find('\0',0x73);
  lVar5 = std::__cxx11::string::find('\0',100);
  if (lVar3 == -1) {
    if (lVar5 == -1) {
      if (lVar4 != -1) {
        std::__cxx11::stringstream::stringstream((stringstream *)&ss);
        pbrt::operator<<(local_1a8,v);
        __format = nextFmt._M_dataplus;
        std::__cxx11::stringbuf::str();
        plVar1 = local_1d8;
        iVar2 = snprintf((char *)0x0,0,__format._M_p,local_1d8);
        str._M_string_length = 0;
        str.field_2._M_local_buf[0] = '\0';
        str._M_dataplus._M_p = (pointer)&str.field_2;
        std::__cxx11::string::resize((ulong)&str,(char)(iVar2 + 1));
        snprintf(str._M_dataplus._M_p,(long)(iVar2 + 1),__format._M_p,plVar1);
        std::__cxx11::string::pop_back();
        std::__cxx11::string::_M_append((char *)s,(ulong)str._M_dataplus._M_p);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)str._M_dataplus._M_p != &str.field_2) {
          operator_delete(str._M_dataplus._M_p,
                          CONCAT71(str.field_2._M_allocated_capacity._1_7_,
                                   str.field_2._M_local_buf[0]) + 1);
        }
        if (local_1d8 != local_1c8) {
          operator_delete(local_1d8,local_1c8[0] + 1);
        }
        std::__cxx11::stringstream::~stringstream((stringstream *)&ss);
        std::ios_base::~ios_base(local_138);
        stringPrintfRecursive<pbrt::SceneEntity_const&,pbrt::SceneEntity_const&,std::vector<std::pair<std::__cxx11::string,pbrt::SceneEntity>,std::allocator<std::pair<std::__cxx11::string,pbrt::SceneEntity>>>const&,std::vector<pbrt::SceneEntity,std::allocator<pbrt::SceneEntity>>const&,std::map<std::__cxx11::string,pbrt::TransformedSceneEntity,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,pbrt::TransformedSceneEntity>>>const&,std::vector<std::pair<std::__cxx11::string,pbrt::TextureSceneEntity>,std::allocator<std::pair<std::__cxx11::string,pbrt::TextureSceneEntity>>>const&,std::vector<std::pair<std::__cxx11::string,pbrt::TextureSceneEntity>,std::allocator<std::pair<std::__cxx11::string,pbrt::TextureSceneEntity>>>const&,std::map<std::__cxx11::string,pbrt::InstanceDefinitionSceneEntity,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,pbrt::InstanceDefinitionSceneEntity>>>const&,std::vector<pbrt::LightSceneEntity,std::allocator<pbrt::LightSceneEntity>>const&,std::vector<pbrt::ShapeSceneEntity,std::allocator<pbrt::ShapeSceneEntity>>const&,std::vector<pbrt::InstanceSceneEntity,std::allocator<pbrt::InstanceSceneEntity>>const&>
                  (s,fmt_local,args,args_1,args_2,args_3,args_4,args_5,args_6,args_7,args_8,args_9,
                   args_10);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)nextFmt._M_dataplus._M_p != &nextFmt.field_2) {
          operator_delete(nextFmt._M_dataplus._M_p,nextFmt.field_2._M_allocated_capacity + 1);
        }
        return;
      }
      if (nextFmt._M_string_length != 0) {
        str._M_dataplus._M_p = "N4pbrt11SceneEntityE";
        _ss = nextFmt._M_dataplus._M_p;
        LogFatal<char_const*,char_const*&>
                  (Fatal,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/util/print.h"
                   ,0xb2,"Printf: Non-basic type %s passed for format string %s",(char **)&str,
                   (char **)&ss);
      }
      s_00 = "Excess values passed to Printf.";
      iVar2 = 0x10d;
    }
    else {
      s_00 = "Non-integral type passed to %d format.";
      iVar2 = 0x104;
    }
  }
  else {
    s_00 = "Non-integral type provided for %* format.";
    iVar2 = 0xe8;
  }
  LogFatal(Fatal,
           "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/util/print.h"
           ,iVar2,s_00);
}

Assistant:

inline void stringPrintfRecursive(std::string *s, const char *fmt, T &&v,
                                  Args &&... args) {
    std::string nextFmt = copyToFormatString(&fmt, s);
    bool precisionViaArg = nextFmt.find('*') != std::string::npos;

    bool isSFmt = nextFmt.find('s') != std::string::npos;
    bool isDFmt = nextFmt.find('d') != std::string::npos;

    if constexpr (std::is_integral<std::decay_t<T>>::value) {
        if (precisionViaArg) {
            stringPrintfRecursiveWithPrecision(s, fmt, nextFmt, v,
                                               std::forward<Args>(args)...);
            return;
        }
    } else if (precisionViaArg)
        LOG_FATAL("Non-integral type provided for %* format.");

    if constexpr (std::is_same<std::decay_t<T>, float>::value)
        if (nextFmt == "%f" || nextFmt == "%s") {
            *s += detail::FloatToString(v);
            goto done;
        }

    if constexpr (std::is_same<std::decay_t<T>, double>::value)
        if (nextFmt == "%f" || nextFmt == "%s") {
            *s += detail::DoubleToString(v);
            goto done;
        }

    if constexpr (std::is_same<std::decay_t<T>, bool>::value)  // FIXME: %-10s with bool
        if (isSFmt) {
            *s += bool(v) ? "true" : "false";
            goto done;
        }

    if constexpr (std::is_integral<std::decay_t<T>>::value) {
        if (isDFmt) {
            nextFmt.replace(nextFmt.find('d'), 1,
                            detail::IntegerFormatTrait<std::decay_t<T>>::fmt());
            *s += formatOne(nextFmt.c_str(), std::forward<T>(v));
            goto done;
        }
    } else if (isDFmt)
        LOG_FATAL("Non-integral type passed to %d format.");

    if (isSFmt) {
        std::stringstream ss;
        ss << v;
        *s += formatOne(nextFmt.c_str(), ss.str().c_str());
    } else if (!nextFmt.empty())
        *s += formatOne(nextFmt.c_str(), std::forward<T>(v));
    else
        LOG_FATAL("Excess values passed to Printf.");

done:
    stringPrintfRecursive(s, fmt, std::forward<Args>(args)...);
}